

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::RenderNavHighlight(ImRect *bb,ImGuiID id,ImGuiNavHighlightFlags flags)

{
  uint in_EDX;
  ImGuiID in_ESI;
  undefined8 *in_RDI;
  bool fully_visible;
  float DISTANCE;
  float THICKNESS;
  ImRect display_rect;
  float rounding;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImVec2 *in_stack_ffffffffffffff38;
  ImDrawList *in_stack_ffffffffffffff40;
  ImRect *in_stack_ffffffffffffff48;
  ImRect *in_stack_ffffffffffffff50;
  undefined8 in_stack_ffffffffffffff58;
  undefined1 intersect_with_current_clip_rect;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  float _x;
  ImVec2 in_stack_ffffffffffffff68;
  ImVec2 in_stack_ffffffffffffff70;
  float local_7c;
  ImVec2 local_78;
  ImVec2 local_70;
  ImVec2 local_68;
  ImVec2 local_60;
  undefined8 local_58;
  undefined8 local_50;
  byte local_45;
  float in_stack_ffffffffffffffc0;
  ImDrawCornerFlags in_stack_ffffffffffffffc4;
  float in_stack_ffffffffffffffc8;
  float col;
  float fVar1;
  float fVar2;
  float fVar3;
  ImGuiWindow *this;
  
  intersect_with_current_clip_rect = (undefined1)((ulong)in_stack_ffffffffffffff58 >> 0x38);
  if ((in_ESI == GImGui->NavId) &&
     ((((GImGui->NavDisableHighlight & 1U) == 0 || ((in_EDX & 4) != 0)) &&
      (this = GImGui->CurrentWindow, ((this->DC).NavHideHighlightOneFrame & 1U) == 0)))) {
    if ((in_EDX & 8) == 0) {
      local_7c = (GImGui->Style).FrameRounding;
    }
    else {
      local_7c = 0.0;
    }
    col = (float)*in_RDI;
    fVar1 = (float)((ulong)*in_RDI >> 0x20);
    fVar2 = (float)in_RDI[1];
    fVar3 = (float)((ulong)in_RDI[1] >> 0x20);
    ImRect::ClipWith(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    if ((in_EDX & 1) != 0) {
      in_stack_ffffffffffffffc8 = 2.0;
      in_stack_ffffffffffffffc4 = 0x40800000;
      ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffbc,4.0,4.0);
      ImRect::Expand((ImRect *)&stack0xffffffffffffffcc,(ImVec2 *)&stack0xffffffffffffffbc);
      local_45 = ImRect::Contains(&this->ClipRect,(ImRect *)&stack0xffffffffffffffcc);
      if (!(bool)local_45) {
        local_50 = CONCAT44(fVar1,col);
        local_58 = CONCAT44(fVar3,fVar2);
        ImDrawList::PushClipRect
                  ((ImDrawList *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                   in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                   (bool)intersect_with_current_clip_rect);
      }
      _x = 1.0;
      ImVec2::ImVec2(&local_68,1.0,1.0);
      local_60 = operator+(in_stack_ffffffffffffff38,(ImVec2 *)0x1287ba);
      ImVec2::ImVec2(&local_78,_x,_x);
      local_70 = operator-(in_stack_ffffffffffffff38,(ImVec2 *)0x1287f4);
      GetColorU32((ImGuiCol)((ulong)in_stack_ffffffffffffff50 >> 0x20),
                  SUB84(in_stack_ffffffffffffff50,0));
      ImDrawList::AddRect((ImDrawList *)this,(ImVec2 *)CONCAT44(local_7c,fVar3),
                          (ImVec2 *)CONCAT44(fVar2,fVar1),(ImU32)col,in_stack_ffffffffffffffc8,
                          in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0);
      if ((local_45 & 1) == 0) {
        ImDrawList::PopClipRect(in_stack_ffffffffffffff40);
      }
    }
    if ((in_EDX & 2) != 0) {
      GetColorU32((ImGuiCol)((ulong)&stack0xffffffffffffffd4 >> 0x20),
                  SUB84(&stack0xffffffffffffffd4,0));
      ImDrawList::AddRect((ImDrawList *)this,(ImVec2 *)CONCAT44(local_7c,fVar3),
                          (ImVec2 *)CONCAT44(fVar2,fVar1),(ImU32)col,in_stack_ffffffffffffffc8,
                          in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0);
    }
  }
  return;
}

Assistant:

void ImGui::RenderNavHighlight(const ImRect& bb, ImGuiID id, ImGuiNavHighlightFlags flags)
{
    ImGuiContext& g = *GImGui;
    if (id != g.NavId)
        return;
    if (g.NavDisableHighlight && !(flags & ImGuiNavHighlightFlags_AlwaysDraw))
        return;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->DC.NavHideHighlightOneFrame)
        return;

    float rounding = (flags & ImGuiNavHighlightFlags_NoRounding) ? 0.0f : g.Style.FrameRounding;
    ImRect display_rect = bb;
    display_rect.ClipWith(window->ClipRect);
    if (flags & ImGuiNavHighlightFlags_TypeDefault)
    {
        const float THICKNESS = 2.0f;
        const float DISTANCE = 3.0f + THICKNESS * 0.5f;
        display_rect.Expand(ImVec2(DISTANCE, DISTANCE));
        bool fully_visible = window->ClipRect.Contains(display_rect);
        if (!fully_visible)
            window->DrawList->PushClipRect(display_rect.Min, display_rect.Max);
        window->DrawList->AddRect(display_rect.Min + ImVec2(THICKNESS * 0.5f, THICKNESS * 0.5f), display_rect.Max - ImVec2(THICKNESS * 0.5f, THICKNESS * 0.5f), GetColorU32(ImGuiCol_NavHighlight), rounding, ImDrawCornerFlags_All, THICKNESS);
        if (!fully_visible)
            window->DrawList->PopClipRect();
    }
    if (flags & ImGuiNavHighlightFlags_TypeThin)
    {
        window->DrawList->AddRect(display_rect.Min, display_rect.Max, GetColorU32(ImGuiCol_NavHighlight), rounding, ~0, 1.0f);
    }
}